

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O2

void pbrt::RGBColorSpace::Init(Allocator alloc)

{
  allocator<char> local_51;
  SpectrumHandle local_50;
  Tuple2<pbrt::Point2,_float> local_48;
  Tuple2<pbrt::Point2,_float> local_40;
  Tuple2<pbrt::Point2,_float> local_38;
  string local_30;
  polymorphic_allocator<std::byte> local_10;
  
  local_38.x = 0.64;
  local_38.y = 0.33;
  local_40.x = 0.3;
  local_40.y = 0.6;
  local_48.x = 0.15;
  local_48.y = 0.06;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"stdillum-D65",&local_51);
  GetNamedSpectrum((pbrt *)&local_50,&local_30);
  sRGB = pstd::pmr::polymorphic_allocator<std::byte>::
         new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                   (&local_10,(Point2<float> *)&local_38,(Point2<float> *)&local_40,
                    (Point2<float> *)&local_48,&local_50,
                    (RGBToSpectrumTable **)&RGBToSpectrumTable::sRGB,&local_10);
  std::__cxx11::string::~string((string *)&local_30);
  local_38.x = 0.68;
  local_38.y = 0.32;
  local_40.x = 0.265;
  local_40.y = 0.69;
  local_48.x = 0.15;
  local_48.y = 0.06;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"stdillum-D65",&local_51);
  GetNamedSpectrum((pbrt *)&local_50,&local_30);
  DCI_P3 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     (&local_10,(Point2<float> *)&local_38,(Point2<float> *)&local_40,
                      (Point2<float> *)&local_48,&local_50,
                      (RGBToSpectrumTable **)&RGBToSpectrumTable::DCI_P3,&local_10);
  std::__cxx11::string::~string((string *)&local_30);
  local_38.x = 0.708;
  local_38.y = 0.292;
  local_40.x = 0.17;
  local_40.y = 0.797;
  local_48.x = 0.131;
  local_48.y = 0.046;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"stdillum-D65",&local_51);
  GetNamedSpectrum((pbrt *)&local_50,&local_30);
  Rec2020 = pstd::pmr::polymorphic_allocator<std::byte>::
            new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                      (&local_10,(Point2<float> *)&local_38,(Point2<float> *)&local_40,
                       (Point2<float> *)&local_48,&local_50,
                       (RGBToSpectrumTable **)&RGBToSpectrumTable::Rec2020,&local_10);
  std::__cxx11::string::~string((string *)&local_30);
  local_38.x = 0.7347;
  local_38.y = 0.2653;
  local_40.x = 0.0;
  local_40.y = 1.0;
  local_48.x = 0.0001;
  local_48.y = -0.077;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"illum-acesD60",&local_51);
  GetNamedSpectrum((pbrt *)&local_50,&local_30);
  ACES2065_1 = pstd::pmr::polymorphic_allocator<std::byte>::
               new_object<pbrt::RGBColorSpace,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::Point2<float>,pbrt::SpectrumHandle,pbrt::RGBToSpectrumTable_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
                         (&local_10,(Point2<float> *)&local_38,(Point2<float> *)&local_40,
                          (Point2<float> *)&local_48,&local_50,
                          (RGBToSpectrumTable **)&RGBToSpectrumTable::ACES2065_1,&local_10);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void RGBColorSpace::Init(Allocator alloc) {
    // Rec. ITU-R BT.709.3
    sRGB = alloc.new_object<RGBColorSpace>(
        Point2f(.64, .33), Point2f(.3, .6), Point2f(.15, .06),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::sRGB, alloc);
    // P3-D65 (display)
    DCI_P3 = alloc.new_object<RGBColorSpace>(
        Point2f(.68, .32), Point2f(.265, .690), Point2f(.15, .06),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::DCI_P3, alloc);
    // ITU-R Rec BT.2020
    Rec2020 = alloc.new_object<RGBColorSpace>(
        Point2f(.708, .292), Point2f(.170, .797), Point2f(.131, .046),
        GetNamedSpectrum("stdillum-D65"), RGBToSpectrumTable::Rec2020, alloc);
    ACES2065_1 = alloc.new_object<RGBColorSpace>(
        Point2f(.7347, .2653), Point2f(0., 1.), Point2f(.0001, -.077),
        GetNamedSpectrum("illum-acesD60"), RGBToSpectrumTable::ACES2065_1, alloc);
#ifdef PBRT_BUILD_GPU_RENDERER
    if (Options->useGPU) {
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_sRGB, &RGBColorSpace::sRGB,
                                      sizeof(RGBColorSpace_sRGB)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_DCI_P3, &RGBColorSpace::DCI_P3,
                                      sizeof(RGBColorSpace_DCI_P3)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_Rec2020, &RGBColorSpace::Rec2020,
                                      sizeof(RGBColorSpace_Rec2020)));
        CUDA_CHECK(cudaMemcpyToSymbol(RGBColorSpace_ACES2065_1,
                                      &RGBColorSpace::ACES2065_1,
                                      sizeof(RGBColorSpace_ACES2065_1)));
    }
#endif
}